

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

ThreeAxisForceTorqueContactSensor * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements
          (ThreeAxisForceTorqueContactSensor *this,VectorDynSize *loadCellMeasurements)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  undefined8 *puVar4;
  VectorDynSize *in_RDX;
  Position *zeroVec;
  ulong uVar5;
  double local_98;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_88;
  Vector3 weightedSumOfLocations;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_60;
  
  lVar1 = iDynTree::VectorDynSize::size();
  if (lVar1 == (*(long *)(*(long *)(loadCellMeasurements + 8) + 0xb0) -
               *(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8)) / 0x18) {
    VectorFixSize<3U>::zero(&weightedSumOfLocations);
    local_98 = 0.0;
    lVar1 = 0;
    for (uVar5 = 0; uVar2 = iDynTree::VectorDynSize::size(), uVar5 < uVar2; uVar5 = uVar5 + 1) {
      pdVar3 = (double *)iDynTree::VectorDynSize::operator()(in_RDX,uVar5);
      local_98 = local_98 + *pdVar3;
      puVar4 = (undefined8 *)iDynTree::VectorDynSize::operator()(in_RDX,uVar5);
      local_60.m_rhs.m_functor.m_other =
           (double)(*(long *)(*(long *)(loadCellMeasurements + 8) + 0xa8) + lVar1);
      local_60.m_rhs._0_8_ = *puVar4;
      local_88._0_8_ = &weightedSumOfLocations;
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>> *)
                 &local_88,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_60);
      lVar1 = lVar1 + 0x18;
    }
    if (1e-09 <= local_98) {
      iDynTree::Position::Position((Position *)this);
      local_60.m_lhs._0_8_ = &weightedSumOfLocations;
      local_60.m_rhs.m_functor.m_other = local_98;
      local_88._0_8_ = this;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_88,&local_60);
      return this;
    }
    iDynTree::reportError
              ("ThreeAxisForceTorqueContactSensor",
               "computeThreeAxisForceTorqueFromLoadCellMeasurements",
               "loadCellMeasurements sum is less than 1e-9");
  }
  else {
    iDynTree::reportError
              ("ThreeAxisForceTorqueContactSensor",
               "computeThreeAxisForceTorqueFromLoadCellMeasurements",
               "loadCellMeasurements has the wrong size");
  }
  iDynTree::Position::Position((Position *)this);
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)this);
  return this;
}

Assistant:

Position ThreeAxisForceTorqueContactSensor::computeCenterOfPressureFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    // We assume that the location of the load cells is on the XY plane. In this case, the cop is just the average of the locations weighted on the measurements
    double sumOfMeasurementsInN=0.0;
    Vector3 weightedSumOfLocations; weightedSumOfLocations.zero();
    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        sumOfMeasurementsInN += loadCellMeasurements(i);
        toEigen(weightedSumOfLocations) += loadCellMeasurements(i)*toEigen(pimpl->m_loadCellLocations[i]);
    }

    if (sumOfMeasurementsInN < 1e-9)
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements sum is less than 1e-9");
        Position zeroVec; zeroVec.zero();
        return zeroVec;
    }

    Position ret;
    toEigen(ret) = toEigen(weightedSumOfLocations)/sumOfMeasurementsInN;
    return ret;
}